

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O3

void fft_c2r_exec(fft_real_object obj,fft_data *inp,double *oup)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup_00;
  double *pdVar7;
  size_t sVar8;
  long lVar9;
  size_t __size;
  double dVar10;
  double dVar11;
  
  obj_00 = obj->cobj;
  iVar6 = obj_00->N;
  lVar9 = (long)iVar6;
  __size = lVar9 * 0x10;
  inp_00 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  if (lVar9 < 1) {
    fft_exec(obj_00,inp_00,oup_00);
  }
  else {
    pdVar7 = &inp[lVar9].im;
    sVar8 = 0;
    do {
      dVar1 = *(double *)((long)&inp->re + sVar8);
      dVar2 = *(double *)((long)&inp->im + sVar8);
      dVar3 = *pdVar7;
      dVar10 = -dVar2 - dVar3;
      dVar11 = dVar1 - ((fft_data *)(pdVar7 + -1))->re;
      dVar4 = *(double *)((long)&obj->twiddle2[0].re + sVar8);
      dVar5 = *(double *)((long)&obj->twiddle2[0].im + sVar8);
      *(double *)((long)&inp_00->re + sVar8) =
           (dVar10 * dVar4 + ((fft_data *)(pdVar7 + -1))->re + dVar1) - dVar11 * dVar5;
      *(double *)((long)&inp_00->im + sVar8) = dVar10 * dVar5 + dVar11 * dVar4 + (dVar2 - dVar3);
      pdVar7 = pdVar7 + -2;
      sVar8 = sVar8 + 0x10;
    } while (__size != sVar8);
    fft_exec(obj_00,inp_00,oup_00);
    if (0 < iVar6) {
      sVar8 = 0;
      do {
        *(undefined8 *)((long)oup + sVar8) = *(undefined8 *)((long)&oup_00->re + sVar8);
        *(undefined8 *)((long)oup + sVar8 + 8) = *(undefined8 *)((long)&oup_00->im + sVar8);
        sVar8 = sVar8 + 0x10;
      } while (__size != sVar8);
    }
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_c2r_exec(fft_real_object obj,fft_data *inp,fft_type *oup) {
	
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		temp1 = -inp[i].im - inp[N2-i].im ;
		temp2 = -inp[N2-i].re + inp[i].re ;
		cinp[i].re = inp[i].re + inp[N2-i].re + (temp1 * obj->twiddle2[i].re) - (temp2 * obj->twiddle2[i].im);
		cinp[i].im = inp[i].im - inp[N2-i].im + (temp2 * obj->twiddle2[i].re) + (temp1 * obj->twiddle2[i].im);
	}
	
	fft_exec(obj->cobj,cinp,coup);
	for (i = 0; i < N2; ++i) {
		oup[2*i] = coup[i].re;
		oup[2*i+1] = coup[i].im;
	}
	free(cinp);
	free(coup);


}